

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdEval(uint *pTruth,int nVars,int nLutSize)

{
  int iVar1;
  int iVar2;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p;
  uint *pIn1;
  
  pNtk = Kit_DsdDecompose(pTruth,nVars);
  iVar1 = Kit_DsdCountLuts(pNtk,nLutSize);
  p = Kit_DsdManAlloc(nVars,(uint)pNtk->nNodes + (uint)pNtk->nVars);
  pIn1 = Kit_DsdTruthCompute(p,pNtk);
  iVar2 = Kit_TruthIsEqual(pTruth,pIn1,nVars);
  if (iVar2 == 0) {
    puts("Verification failed.");
  }
  Kit_DsdManFree(p);
  Kit_DsdNtkFree(pNtk);
  return iVar1;
}

Assistant:

int Kit_DsdEval( unsigned * pTruth, int nVars, int nLutSize )
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk;
    unsigned * pTruthC;
    int Result;

    // decompose the function
    pNtk = Kit_DsdDecompose( pTruth, nVars );
    Result = Kit_DsdCountLuts( pNtk, nLutSize );
//    printf( "\n" );
//    Kit_DsdPrint( stdout, pNtk );
//    printf( "Eval = %d.\n", Result );

    // recompute the truth table
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Kit_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );

    Kit_DsdNtkFree( pNtk );
    return Result;
}